

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  FILE *source;
  char *pcVar3;
  TokenList *list;
  Code CVar4;
  Code c;
  Code all;
  TokenList *tokens;
  char *string;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    source = fopen(argv[1],"rb");
    if (source == (FILE *)0x0) {
      printf("\x1b[31m\n[Error] Unable to open file %s!\x1b[0m",argv[1]);
      argv_local._4_4_ = 1;
    }
    else {
      pcVar3 = read_all((FILE *)source);
      pcVar3 = preprocess(pcVar3);
      initScanner(pcVar3);
      list = scanTokens();
      iVar1 = hasScanErrors();
      if (iVar1 == 0) {
        CVar4 = parse(list);
        iVar1 = hasParseError();
        if (iVar1 == 0) {
          freeList(list);
          c._4_4_ = 0;
          c.count = CVar4.count;
          c.parts = CVar4.parts;
          interpret(c);
          printf("\n");
          argv_local._4_4_ = 0;
        }
        else {
          uVar2 = hasParseError();
          printf("\x1b[31m\n[Error] %d errors occured while parsing. Correct them and try to run again.\n\x1b[0m"
                 ,(ulong)uVar2);
          argv_local._4_4_ = 1;
        }
      }
      else {
        uVar2 = hasScanErrors();
        printf("\x1b[31m\n[Error] %d errors occured while scanning. Correct them and try to run again.\n\x1b[0m"
               ,(ulong)uVar2);
        argv_local._4_4_ = 1;
      }
    }
  }
  else {
    argv_local._4_4_ = 2;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv){
//    printSize();
    if(argc != 2)
        return 2;
    FILE *f = fopen(argv[1], "rb");
    if(f == NULL){
        printf(error("Unable to open file %s!"), argv[1]);
        return 1;
    }

    char *string = read_all(f);

    string = preprocess(string);
    
//    printf(debug("Final source : \n%s\n"), string);

    initScanner(string);

    TokenList *tokens = scanTokens();
    if(hasScanErrors()){
        printf(error("%d errors occured while scanning. Correct them and try to run again.\n"), hasScanErrors());
        memfree_all();
        return 1;
    }
//    printList(tokens);

    Code all = parse(tokens);
    if(hasParseError()){
        printf(error("%d errors occured while parsing. Correct them and try to run again.\n"), hasParseError());
        memfree_all();
        return 1;
    }

    freeList(tokens);
    interpret(all);

    memfree_all();

    printf("\n");
    return 0;
}